

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::LinearDerivateCase::init(LinearDerivateCase *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int extraout_EAX;
  RenderTarget *pRVar9;
  char *pcVar10;
  mapped_type *pmVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  Precision PVar15;
  DataType DVar16;
  Precision precision;
  char *pcVar17;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragmentParams;
  key_type local_f0;
  allocator<char> local_c9;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  string local_70;
  StringTemplate local_50;
  
  PVar15 = (this->super_TriangleDerivateCase).m_surfaceType;
  if (PVar15 == PRECISION_LOWP) {
    pRVar9 = Context::getRenderTarget((this->super_TriangleDerivateCase).super_TestCase.m_context);
    iVar14 = 0xa7;
    if (pRVar9->m_width < 0xa7) {
      iVar14 = pRVar9->m_width;
    }
    pRVar9 = Context::getRenderTarget((this->super_TriangleDerivateCase).super_TestCase.m_context);
    iVar13 = 0x67;
    if (pRVar9->m_height < 0x67) {
      iVar13 = pRVar9->m_height;
    }
    local_98._4_4_ = extraout_XMM0_Db;
    local_98._0_4_ = (float)iVar14;
    local_98._8_4_ = extraout_XMM0_Dc;
    local_98._12_4_ = extraout_XMM0_Dd;
    PVar15 = (this->super_TriangleDerivateCase).m_surfaceType;
    local_88 = ZEXT416((uint)(float)iVar13);
  }
  else {
    local_88._0_12_ = ZEXT812(0x43050000);
    local_88._12_4_ = 0;
    local_98._0_12_ = ZEXT812(0x42c60000);
    local_98._12_4_ = 0;
  }
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  DVar16 = TYPE_FLOAT_VEC4;
  if (PVar15 == PRECISION_HIGHP) {
    DVar16 = TYPE_UINT_VEC4;
  }
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  pcVar10 = glu::getDataTypeName(DVar16);
  paVar1 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"OUTPUT_TYPE","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_c8,&local_f0);
  pcVar17 = (char *)pmVar11->_M_string_length;
  strlen(pcVar10);
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,pcVar17,(ulong)pcVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  precision = PVar15;
  if (PVar15 != PRECISION_HIGHP) {
    precision = (this->super_TriangleDerivateCase).m_precision;
  }
  pcVar10 = glu::getPrecisionName(precision);
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"OUTPUT_PREC","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_c8,&local_f0);
  pcVar17 = (char *)pmVar11->_M_string_length;
  strlen(pcVar10);
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,pcVar17,(ulong)pcVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pcVar10 = glu::getPrecisionName((this->super_TriangleDerivateCase).m_precision);
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"PRECISION","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_c8,&local_f0);
  pcVar17 = (char *)pmVar11->_M_string_length;
  strlen(pcVar10);
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,pcVar17,(ulong)pcVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pcVar10 = glu::getDataTypeName((this->super_TriangleDerivateCase).m_dataType);
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"DATATYPE","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_c8,&local_f0);
  pcVar17 = (char *)pmVar11->_M_string_length;
  strlen(pcVar10);
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,pcVar17,(ulong)pcVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  uVar12 = (ulong)*(uint *)&(this->super_TriangleDerivateCase).field_0xf4;
  if (uVar12 < 3) {
    pcVar17 = (&PTR_anon_var_dwarf_18e244_00d0d998)[uVar12];
  }
  else {
    pcVar17 = (char *)0x0;
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"FUNC","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_c8,&local_f0);
  pcVar10 = (char *)pmVar11->_M_string_length;
  strlen(pcVar17);
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,pcVar10,(ulong)pcVar17);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  DVar16 = (this->super_TriangleDerivateCase).m_dataType;
  if (PVar15 == PRECISION_HIGHP) {
    if (DVar16 == TYPE_FLOAT_VEC3) {
      pcVar17 = "floatBitsToUint(vec4(res, 1.0))";
    }
    else if (DVar16 == TYPE_FLOAT_VEC4) {
      pcVar17 = "floatBitsToUint(res)";
    }
    else {
      pcVar17 = "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
      if (DVar16 == TYPE_FLOAT_VEC2) {
        pcVar17 = "floatBitsToUint(vec4(res, 0.0, 1.0))";
      }
    }
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CAST_TO_OUTPUT","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_c8,&local_f0);
    pcVar10 = (char *)pmVar11->_M_string_length;
    strlen(pcVar17);
    std::__cxx11::string::_M_replace((ulong)pmVar11,0,pcVar10,(ulong)pcVar17);
  }
  else {
    if (DVar16 == TYPE_FLOAT_VEC3) {
      pcVar17 = "vec4(res, 1.0)";
    }
    else if (DVar16 == TYPE_FLOAT_VEC4) {
      pcVar17 = "res";
    }
    else {
      pcVar17 = "vec4(res, 0.0, 0.0, 1.0)";
      if (DVar16 == TYPE_FLOAT_VEC2) {
        pcVar17 = "vec4(res, 0.0, 1.0)";
      }
    }
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CAST_TO_OUTPUT","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_c8,&local_f0);
    pcVar10 = (char *)pmVar11->_M_string_length;
    strlen(pcVar17);
    std::__cxx11::string::_M_replace((ulong)pmVar11,0,pcVar10,(ulong)pcVar17);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,(this->m_fragmentTmpl)._M_dataplus._M_p,&local_c9);
  tcu::StringTemplate::StringTemplate(&local_50,&local_70);
  tcu::StringTemplate::specialize
            (&local_f0,&local_50,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_c8);
  std::__cxx11::string::operator=
            ((string *)&(this->super_TriangleDerivateCase).m_fragmentSrc,(string *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar12 = (ulong)(this->super_TriangleDerivateCase).m_precision;
  if (uVar12 < 3) {
    fVar2 = *(float *)(&DAT_00b1ab2c + uVar12 * 4);
    fVar3 = *(float *)(&DAT_00b1ab38 + uVar12 * 4);
    fVar4 = *(float *)(&DAT_00b1ab44 + uVar12 * 4);
    fVar5 = *(float *)(&DAT_00b1ab50 + uVar12 * 4);
    fVar6 = *(float *)(&DAT_00b1ab5c + uVar12 * 4);
    fVar7 = *(float *)(&DAT_00b1ab68 + uVar12 * 4);
    fVar8 = *(float *)(&DAT_00b1ab74 + uVar12 * 4);
    (this->super_TriangleDerivateCase).m_coordMin.m_data[0] = *(float *)(&DAT_00b1ab20 + uVar12 * 4)
    ;
    (this->super_TriangleDerivateCase).m_coordMin.m_data[1] = fVar2;
    (this->super_TriangleDerivateCase).m_coordMin.m_data[2] = fVar3;
    (this->super_TriangleDerivateCase).m_coordMin.m_data[3] = fVar4;
    (this->super_TriangleDerivateCase).m_coordMax.m_data[0] = fVar5;
    (this->super_TriangleDerivateCase).m_coordMax.m_data[1] = fVar6;
    (this->super_TriangleDerivateCase).m_coordMax.m_data[2] = fVar7;
    (this->super_TriangleDerivateCase).m_coordMax.m_data[3] = fVar8;
  }
  auVar18 = _DAT_00ad8c60;
  if ((this->super_TriangleDerivateCase).m_surfaceType != SURFACETYPE_FLOAT_FBO) {
    auVar18._0_8_ =
         CONCAT44((this->super_TriangleDerivateCase).m_coordMax.m_data[1] -
                  (this->super_TriangleDerivateCase).m_coordMin.m_data[1],
                  (this->super_TriangleDerivateCase).m_coordMax.m_data[0] -
                  (this->super_TriangleDerivateCase).m_coordMin.m_data[0]);
    auVar18._8_4_ =
         (this->super_TriangleDerivateCase).m_coordMax.m_data[2] -
         (this->super_TriangleDerivateCase).m_coordMin.m_data[2];
    auVar18._12_4_ =
         (this->super_TriangleDerivateCase).m_coordMax.m_data[3] -
         (this->super_TriangleDerivateCase).m_coordMin.m_data[3];
    auVar22._4_4_ = local_98._0_4_;
    auVar22._0_4_ = local_98._0_4_;
    auVar22._12_4_ = (float)local_98._0_4_ * -0.5;
    auVar22._8_4_ = (float)local_98._0_4_ * 0.5;
    auVar19._8_4_ = auVar18._8_4_;
    auVar19._0_8_ = auVar18._0_8_;
    auVar19._12_4_ = auVar18._12_4_;
    auVar19 = divps(auVar19,auVar22);
    auVar23._4_4_ = local_88._0_4_;
    auVar23._0_4_ = local_88._0_4_;
    auVar23._12_4_ = (float)local_88._0_4_ * -0.5;
    auVar23._8_4_ = (float)local_88._0_4_ * 0.5;
    auVar18 = divps(auVar18,auVar23);
    iVar14 = *(int *)&(this->super_TriangleDerivateCase).field_0xf4;
    if (iVar14 == 2) {
      auVar24._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
      auVar24._8_4_ = auVar19._8_4_ ^ 0x80000000;
      auVar24._12_4_ = auVar19._12_4_ ^ 0x80000000;
      auVar19 = maxps(auVar24,auVar19);
      auVar20._0_8_ = auVar18._0_8_ ^ 0x8000000080000000;
      auVar20._8_4_ = auVar18._8_4_ ^ 0x80000000;
      auVar20._12_4_ = auVar18._12_4_ ^ 0x80000000;
      auVar18 = maxps(auVar20,auVar18);
      auVar21._0_4_ = auVar18._0_4_ + auVar19._0_4_;
      auVar21._4_4_ = auVar18._4_4_ + auVar19._4_4_;
      auVar21._8_4_ = auVar18._8_4_ + auVar19._8_4_;
      auVar21._12_4_ = auVar18._12_4_ + auVar19._12_4_;
      auVar18 = divps(_DAT_00ae0e70,auVar21);
    }
    else {
      if (iVar14 == 1) {
        auVar18 = divps(_DAT_00ae0e70,auVar18);
        *(undefined1 (*) [16])(this->super_TriangleDerivateCase).m_derivScale.m_data = auVar18;
        goto LAB_0064aedb;
      }
      if (iVar14 != 0) goto LAB_0064aedb;
      auVar18 = divps(_DAT_00ae0e70,auVar19);
    }
  }
  *(undefined1 (*) [16])(this->super_TriangleDerivateCase).m_derivScale.m_data = auVar18;
LAB_0064aedb:
  (this->super_TriangleDerivateCase).m_derivBias.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[1] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[2] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[3] = 0.0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_c8);
  return extraout_EAX;
}

Assistant:

void LinearDerivateCase::init (void)
{
	const tcu::IVec2	viewportSize	= getViewportSize();
	const float			w				= float(viewportSize.x());
	const float			h				= float(viewportSize.y());
	const bool			packToInt		= m_surfaceType == SURFACETYPE_FLOAT_FBO;
	map<string, string>	fragmentParams;

	fragmentParams["OUTPUT_TYPE"]		= glu::getDataTypeName(packToInt ? glu::TYPE_UINT_VEC4 : glu::TYPE_FLOAT_VEC4);
	fragmentParams["OUTPUT_PREC"]		= glu::getPrecisionName(packToInt ? glu::PRECISION_HIGHP : m_precision);
	fragmentParams["PRECISION"]			= glu::getPrecisionName(m_precision);
	fragmentParams["DATATYPE"]			= glu::getDataTypeName(m_dataType);
	fragmentParams["FUNC"]				= getDerivateFuncName(m_func);

	if (packToInt)
	{
		fragmentParams["CAST_TO_OUTPUT"]	= m_dataType == glu::TYPE_FLOAT_VEC4 ? "floatBitsToUint(res)" :
											  m_dataType == glu::TYPE_FLOAT_VEC3 ? "floatBitsToUint(vec4(res, 1.0))" :
											  m_dataType == glu::TYPE_FLOAT_VEC2 ? "floatBitsToUint(vec4(res, 0.0, 1.0))" :
											  /* TYPE_FLOAT */					   "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
	}
	else
	{
		fragmentParams["CAST_TO_OUTPUT"]	= m_dataType == glu::TYPE_FLOAT_VEC4 ? "res" :
											  m_dataType == glu::TYPE_FLOAT_VEC3 ? "vec4(res, 1.0)" :
											  m_dataType == glu::TYPE_FLOAT_VEC2 ? "vec4(res, 0.0, 1.0)" :
											  /* TYPE_FLOAT */					   "vec4(res, 0.0, 0.0, 1.0)";
	}

	m_fragmentSrc = tcu::StringTemplate(m_fragmentTmpl.c_str()).specialize(fragmentParams);

	switch (m_precision)
	{
		case glu::PRECISION_HIGHP:
			m_coordMin = tcu::Vec4(-97.f, 0.2f, 71.f, 74.f);
			m_coordMax = tcu::Vec4(-13.2f, -77.f, 44.f, 76.f);
			break;

		case glu::PRECISION_MEDIUMP:
			m_coordMin = tcu::Vec4(-37.0f, 47.f, -7.f, 0.0f);
			m_coordMax = tcu::Vec4(-1.0f, 12.f, 7.f, 19.f);
			break;

		case glu::PRECISION_LOWP:
			m_coordMin = tcu::Vec4(0.0f, -1.0f, 0.0f, 1.0f);
			m_coordMax = tcu::Vec4(1.0f, 1.0f, -1.0f, -1.0f);
			break;

		default:
			DE_ASSERT(false);
	}

	if (m_surfaceType == SURFACETYPE_FLOAT_FBO)
	{
		// No scale or bias used for accuracy.
		m_derivScale	= tcu::Vec4(1.0f);
		m_derivBias		= tcu::Vec4(0.0f);
	}
	else
	{
		// Compute scale - bias that normalizes to 0..1 range.
		const tcu::Vec4 dx = (m_coordMax - m_coordMin) / tcu::Vec4(w, w, w*0.5f, -w*0.5f);
		const tcu::Vec4 dy = (m_coordMax - m_coordMin) / tcu::Vec4(h, h, h*0.5f, -h*0.5f);

		switch (m_func)
		{
			case DERIVATE_DFDX:
				m_derivScale = 0.5f / dx;
				break;

			case DERIVATE_DFDY:
				m_derivScale = 0.5f / dy;
				break;

			case DERIVATE_FWIDTH:
				m_derivScale = 0.5f / (tcu::abs(dx) + tcu::abs(dy));
				break;

			default:
				DE_ASSERT(false);
		}

		m_derivBias = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}